

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmuni_cs.cpp
# Opt level: O1

wchar_t t3_simple_case_fold(wchar_t ch)

{
  ulong uVar1;
  
  if (case_tab[ch >> 7] == (case_table *)0x0) {
    return L'\0';
  }
  uVar1 = (ulong)case_tab[ch >> 7][(uint)(ch & 0x7f)].lower;
  if ((uVar1 != 0) && (case_expansion[uVar1 + 1] == L'\0')) {
    return case_expansion[uVar1];
  }
  return ch;
}

Assistant:

wchar_t t3_simple_case_fold(wchar_t ch)
{
    case_table *e = case_tab[ch >> 7];
    if (e == 0)
        return 0;
    int ofs = e[ch & 127].lower;
    return ofs == 0 ? ch :
           case_expansion[ofs + 1] != 0 ? ch :
           case_expansion[ofs];
}